

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _all.c
# Opt level: O3

void GREATEST_PRINT_REPORT(void)

{
  char *pcVar1;
  char *pcVar2;
  
  if ((greatest_info.flags & 2) != 0) {
    return;
  }
  greatest_info.teardown = (undefined1 *)0x0;
  greatest_info.teardown_udata = (void *)0x0;
  greatest_info.setup = (undefined1 *)0x0;
  greatest_info.setup_udata = (void *)0x0;
  greatest_info.passed = greatest_info.passed + greatest_info.suite.passed;
  greatest_info.failed = greatest_info.failed + greatest_info.suite.failed;
  greatest_info.skipped = greatest_info.skipped + greatest_info.suite.skipped;
  greatest_info.tests_run = greatest_info.tests_run + greatest_info.suite.tests_run;
  greatest_info.suite.tests_run = 0;
  greatest_info.suite.passed = 0;
  greatest_info.suite.failed = 0;
  greatest_info.suite.skipped = 0;
  greatest_info.suite.pre_suite = 0;
  greatest_info.suite.post_suite = 0;
  greatest_info.suite.pre_test = 0;
  greatest_info.suite.post_test = 0;
  greatest_info.col = 0;
  greatest_info.end = clock();
  if (greatest_info.end != -1) {
    pcVar2 = "s";
    pcVar1 = "s";
    if (greatest_info.tests_run == 1) {
      pcVar1 = "";
    }
    fprintf(_stdout,"\nTotal: %u test%s",(ulong)greatest_info.tests_run,pcVar1);
    fprintf(_stdout," (%lu ticks, %.3f sec)",
            SUB84((double)(greatest_info.end - greatest_info.begin) / 1000000.0,0));
    if (greatest_info.assertions == 1) {
      pcVar2 = "";
    }
    fprintf(_stdout,", %u assertion%s\n",(ulong)greatest_info.assertions,pcVar2);
    fprintf(_stdout,"Pass: %u, fail: %u, skip: %u.\n",greatest_info._56_8_ & 0xffffffff,
            (ulong)greatest_info._56_8_ >> 0x20,(ulong)greatest_info.skipped);
    return;
  }
  fprintf(_stdout,"clock error: %s\n","greatest_info.end");
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN();

    RUN_SUITE(CGTFS_Database);
    RUN_SUITE(CGTFS_DatabaseStoring);
    RUN_SUITE(CGTFS_DatabaseFetching);  // Run CGTFS_DatabaseStoring first!
    RUN_SUITE(CGTFS_DatabaseUtils);

    RUN_SUITE(CGTFS_DatabaseAgency);
    RUN_SUITE(CGTFS_DatabaseCalendarDates);
    RUN_SUITE(CGTFS_DatabaseCalendarRecords);
    RUN_SUITE(CGTFS_DatabaseFareAttributes);
    RUN_SUITE(CGTFS_DatabaseFareFule);
    RUN_SUITE(CGTFS_DatabaseFeedInfo);
    RUN_SUITE(CGTFS_DatabaseFrequency);
    RUN_SUITE(CGTFS_DatabaseLevel);
    RUN_SUITE(CGTFS_DatabasePathway);
    RUN_SUITE(CGTFS_DatabaseRoute);
    RUN_SUITE(CGTFS_DatabaseShape);
    RUN_SUITE(CGTFS_DatabaseStopTime);
    RUN_SUITE(CGTFS_DatabaseStop);
    RUN_SUITE(CGTFS_DatabaseTransfers);
    RUN_SUITE(CGTFS_DatabaseTrip);

    RUN_SUITE(CGTFS_EnumParsing);
    RUN_SUITE(CGTFS_Feed);
    RUN_SUITE(CGTFS_Filenames);
    RUN_SUITE(CGTFS_Haversine);

    RUN_SUITE(CGTFS_FileUtils);
    RUN_SUITE(CGTFS_StrUtils);

    RUN_SUITE(CGTFS_RecordAgency);
    RUN_SUITE(CGTFS_RecordCalendarDate);
    RUN_SUITE(CGTFS_RecordCalendarRecord);
    RUN_SUITE(CGTFS_RecordFareAttributes);
    RUN_SUITE(CGTFS_RecordFareRule);
    RUN_SUITE(CGTFS_RecordFeedInfo);
    RUN_SUITE(CGTFS_RecordFrequency);
    RUN_SUITE(CGTFS_RecordLevel);
    RUN_SUITE(CGTFS_RecordPathway);
    RUN_SUITE(CGTFS_RecordRoute);
    RUN_SUITE(CGTFS_RecordShape);
    RUN_SUITE(CGTFS_RecordStopTime);
    RUN_SUITE(CGTFS_RecordStop);
    RUN_SUITE(CGTFS_RecordTransfer);
    RUN_SUITE(CGTFS_RecordTrip);

    RUN_SUITE(CGTFS_FileReading);

    GREATEST_MAIN_END();
}